

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ion_file.c
# Opt level: O1

ion_file_offset_t ion_fend(ion_file_handle_t file)

{
  long __off;
  long lVar1;
  
  __off = ftell((FILE *)file);
  fseek((FILE *)file,0,2);
  lVar1 = ftell((FILE *)file);
  fseek((FILE *)file,__off,0);
  return lVar1;
}

Assistant:

ion_file_offset_t
ion_fend(
	ion_file_handle_t file
) {
	ion_file_offset_t	previous;
	ion_file_offset_t	to_return;

	previous	= ion_ftell(file);
	ion_fseek(file, 0, ION_FILE_END);
	to_return	= ion_ftell(file);
	ion_fseek(file, previous, ION_FILE_START);

	return to_return;
}